

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_endpoint.hpp
# Opt level: O3

void __thiscall
websocketpp::server<websocketpp::config::asio>::start_accept
          (server<websocketpp::config::asio> *this,error_code *ec)

{
  undefined8 uVar1;
  error_category *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  connection_ptr con;
  _Any_data local_78;
  transport_con_ptr local_68;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  _Any_data local_38;
  
  if ((this->
      super_endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>)
      .super_transport_type.m_state != LISTENING) {
    if (error::get_category()::instance == '\0') {
      start_accept();
    }
    ec->_M_value = 0x19;
    ec->_M_cat = (error_category *)&error::get_category()::instance;
    return;
  }
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::
  create_connection((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                     *)&local_78);
  uVar1 = local_78._M_unused._0_8_;
  if ((connection<websocketpp::config::asio> *)local_78._M_unused._0_8_ ==
      (connection<websocketpp::config::asio> *)0x0) {
    if (error::get_category()::instance == '\0') {
      start_accept();
    }
    ec->_M_value = 0x11;
    ec->_M_cat = (error_category *)&error::get_category()::instance;
    goto LAB_0018d1cc;
  }
  local_68.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_78._M_unused._0_8_;
  local_68.
  super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0018d11c:
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0018d11c;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_78._8_8_ + 8) = *(_Atomic_word *)(local_78._8_8_ + 8) + 1;
    }
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  pcStack_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(code **)local_58._M_unused._0_8_ = handle_accept;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = uVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x18) = p_Var3
  ;
  pcStack_40 = std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>_>
               ::_M_invoke;
  *(server<websocketpp::config::asio> **)((long)local_58._M_unused._0_8_ + 0x20) = this;
  pcStack_48 = std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>_>
               ::_M_manager;
  transport::asio::endpoint<websocketpp::config::asio::transport_config>::async_accept
            ((endpoint<websocketpp::config::asio::transport_config> *)this,&local_68,
             (accept_handler *)&local_58,ec);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_68.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((ec->_M_value != 0) &&
     ((connection<websocketpp::config::asio> *)local_78._M_unused._0_8_ !=
      (connection<websocketpp::config::asio> *)0x0)) {
    local_38._0_4_ = 0;
    local_38._8_8_ = peVar2;
    connection<websocketpp::config::asio>::terminate
              ((connection<websocketpp::config::asio> *)local_78._M_unused._0_8_,
               (error_code *)&local_38);
  }
LAB_0018d1cc:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  return;
}

Assistant:

void start_accept(lib::error_code & ec) {
        if (!transport_type::is_listening()) {
            ec = error::make_error_code(error::async_accept_not_listening);
            return;
        }
        
        ec = lib::error_code();
        connection_ptr con = get_connection();

        if (!con) {
          ec = error::make_error_code(error::con_creation_failed);
          return;
        }

        transport_type::async_accept(
            lib::static_pointer_cast<transport_con_type>(con),
            lib::bind(&type::handle_accept,this,con,lib::placeholders::_1),
            ec
        );

        if (ec && con) {
            // If the connection was constructed but the accept failed,
            // terminate the connection to prevent memory leaks
            con->terminate(lib::error_code());
        }
    }